

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplerate.c
# Opt level: O3

SRC_STATE * src_new(int converter_type,int channels,int *error)

{
  SRC_STATE *pSVar1;
  int converter_type_00;
  SRC_ERROR temp_error;
  SRC_ERROR local_c;
  
  switch(converter_type) {
  case 0:
    converter_type_00 = 0;
    break;
  case 1:
    converter_type_00 = 1;
    break;
  case 2:
    converter_type_00 = 2;
    break;
  case 3:
    pSVar1 = zoh_state_new(channels,&local_c);
    goto LAB_00101ab5;
  case 4:
    pSVar1 = linear_state_new(channels,&local_c);
    goto LAB_00101ab5;
  default:
    local_c = SRC_ERR_BAD_CONVERTER;
    pSVar1 = (SRC_STATE *)0x0;
    goto LAB_00101ab5;
  }
  pSVar1 = sinc_state_new(converter_type_00,channels,&local_c);
LAB_00101ab5:
  if (error != (int *)0x0) {
    *error = local_c;
  }
  return pSVar1;
}

Assistant:

SRC_STATE *
src_new (int converter_type, int channels, int *error)
{
	return psrc_set_converter (converter_type, channels, error) ;
}